

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O3

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,SystemSockAddrIn *s)

{
  ushort uVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *__s;
  
  (this->sa).super_type.m_initialized = false;
  uVar3 = *(undefined8 *)s->sin_zero;
  *(undefined8 *)&(this->sa).super_type.m_storage.dummy_ = *(undefined8 *)s;
  *(undefined8 *)((long)&(this->sa).super_type.m_storage.dummy_ + 8) = uVar3;
  (this->sa).super_type.m_initialized = true;
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  (this->host)._M_string_length = 0;
  (this->host).field_2._M_local_buf[0] = '\0';
  __s = inet_ntoa((in_addr)*(in_addr_t *)((long)&(this->sa).super_type.m_storage.dummy_ + 4));
  pcVar2 = (char *)(this->host)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->host,0,pcVar2,(ulong)__s);
  if ((this->sa).super_type.m_initialized != false) {
    uVar1 = *(ushort *)((long)&(this->sa).super_type.m_storage.dummy_ + 2);
    this->port = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    return;
  }
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                "pointer_type boost::optional<sockaddr_in>::operator->() [T = sockaddr_in]");
}

Assistant:

Inet_addr::Impl::Impl( const SystemSockAddrIn& s ):
  sa(s)
{
  host = inet_ntoa( sa->sin_addr );
  port = ntohs( sa->sin_port );
}